

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

Data * __thiscall ON_EmbeddedFile::CImpl::Data::operator=(Data *this,Data *d)

{
  bool bVar1;
  pointer __dest;
  pointer __src;
  Data *d_local;
  Data *this_local;
  
  if (this != d) {
    SetLength(this,d->m_length);
    this->m_compressed_length = d->m_compressed_length;
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
    if (bVar1) {
      __dest = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                         (&this->m_buffer);
      __src = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                        (&d->m_buffer);
      memcpy(__dest,__src,this->m_length);
    }
    else {
      this->m_compressed_length = 0;
      this->m_length = 0;
    }
    this->m_error = (bool)(d->m_error & 1);
  }
  return this;
}

Assistant:

const ON_EmbeddedFile::CImpl::Data& ON_EmbeddedFile::CImpl::Data::operator = (const Data& d)
{
  if (this == &d)
    return *this;

  SetLength(d.m_length);

  m_compressed_length = d.m_compressed_length;

  if (m_buffer)
  {
    memcpy(m_buffer.get(), d.m_buffer.get(), m_length);
  }
  else
  {
    m_length = m_compressed_length = 0;
  }

  m_error = d.m_error;

  return *this;
}